

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall
crnd::crn_unpacker::unpack_etc1
          (crn_unpacker *this,uint8 **pDst,uint32 output_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  block_buffer_element *pbVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  crn_header *pcVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  symbol_codec *this_00;
  crn_unpacker *pcVar11;
  undefined4 in_register_00000084;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  uint8 e1 [4];
  uint8 e0 [4];
  uint8 block_endpoint [4];
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint32 local_b8;
  uint local_b4;
  uint local_b0;
  undefined4 local_ac;
  crn_unpacker *local_a8;
  uint local_9c;
  undefined8 local_98;
  ulong local_90;
  static_huffman_data_model *local_88;
  vector<crnd::crn_unpacker::block_buffer_element> *local_80;
  uint8 *local_78;
  uint8 **local_70;
  ulong local_68;
  long local_60;
  static_huffman_data_model *local_58;
  ulong local_50;
  ulong local_48;
  static_huffman_data_model *local_40;
  symbol_codec *local_38;
  
  local_98 = CONCAT44(in_register_00000084,output_height);
  local_b8 = (this->m_color_endpoints).m_size;
  uVar14 = (this->m_block_buffer).m_size;
  uVar7 = output_width + 1 & 0xfffffffe;
  local_90 = (ulong)uVar7;
  uVar13 = uVar7 * 2;
  local_80 = &this->m_block_buffer;
  local_a8 = this;
  local_70 = pDst;
  if (uVar14 < uVar13) {
    if ((uVar13 <= (this->m_block_buffer).m_capacity) ||
       (bVar2 = elemental_vector::increase_capacity
                          ((elemental_vector *)local_80,uVar13,uVar14 + 1 == uVar13,8,
                           (object_mover)0x0), bVar2)) {
      (local_a8->m_block_buffer).m_size = uVar13;
    }
    else {
      (local_a8->m_block_buffer).m_alloc_failed = true;
    }
  }
  pcVar6 = local_a8->m_pHeader;
  if ((pcVar6->m_faces).m_buf[0] != '\0') {
    local_bc = (int)local_98 + 1U & 0xfffffffe;
    this_00 = &local_a8->m_codec;
    local_58 = &local_a8->m_reference_encoding_dm;
    local_88 = local_a8->m_endpoint_delta_dm;
    local_40 = local_a8->m_selector_delta_dm;
    local_60 = (long)(int)((output_pitch_in_bytes >> 2) + uVar7 * -2);
    local_48 = (ulong)output_width;
    local_50 = local_90 & 0xffffffff;
    local_68 = 0;
    uVar14 = 0;
    local_b4 = 0;
    pcVar11 = local_a8;
    local_38 = this_00;
    do {
      if (local_bc != 0) {
        local_78 = local_70[local_68];
        local_c4 = 0;
        do {
          if ((int)local_90 != 0) {
            bVar2 = local_c4 < (uint)local_98;
            uVar16 = 0;
            do {
              bVar17 = uVar16 < local_48;
              uVar8 = (ulong)(uint)((int)uVar16 * 2);
              pbVar1 = local_80->m_p;
              if ((local_c4 & 1) != 0) {
                uVar13 = (uint)(byte)pbVar1[uVar8].endpoint_reference;
                switch(uVar13 & 3) {
                case 1:
                  goto switchD_00116274_caseD_1;
                case 2:
                  goto switchD_00116274_caseD_2;
                case 3:
                  goto switchD_00116274_caseD_3;
                }
switchD_00116274_caseD_0:
                uVar4 = symbol_codec::decode(this_00,local_88);
                uVar3 = local_b8;
                if (uVar4 + uVar14 < local_b8) {
                  uVar3 = 0;
                }
                uVar14 = (uVar4 + uVar14) - uVar3;
                pcVar11 = local_a8;
                goto LAB_001162d1;
              }
              uVar3 = symbol_codec::decode(this_00,local_58);
              uVar13 = uVar3 >> 2 & 0xc;
              pbVar1[uVar8].endpoint_reference =
                   (ushort)(uVar3 >> 4) & 0xc | (ushort)(uVar3 >> 2) & 3;
              pcVar11 = local_a8;
              switch(uVar3 & 3) {
              case 0:
                goto switchD_00116274_caseD_0;
              case 1:
switchD_00116274_caseD_1:
                break;
              case 2:
switchD_00116274_caseD_2:
                uVar14 = (uint)pbVar1[uVar8].color_endpoint_index;
                goto LAB_001162d7;
              case 3:
switchD_00116274_caseD_3:
                uVar14 = local_b4;
              }
LAB_001162d1:
              pbVar1[uVar8].color_endpoint_index = (uint16)uVar14;
LAB_001162d7:
              uVar15 = (ulong)uVar14;
              local_b0 = (pcVar11->m_color_endpoints).m_p[uVar15];
              local_9c = local_b0;
              uVar3 = symbol_codec::decode(this_00,local_40);
              if ((uVar13 & 0xfc) != 0) {
                uVar5 = symbol_codec::decode(this_00,local_88);
                uVar4 = local_b8;
                if (uVar5 + uVar14 < local_b8) {
                  uVar4 = 0;
                }
                uVar14 = (uVar5 + uVar14) - uVar4;
                uVar15 = (ulong)uVar14;
              }
              bVar2 = (bool)(bVar2 & bVar17);
              pbVar1 = (local_a8->m_block_buffer).m_p;
              local_b4 = (uint)pbVar1[uVar8 | 1].color_endpoint_index;
              pbVar1[uVar8 + 1].color_endpoint_index = (uint16)uVar14;
              local_c0 = (local_a8->m_color_endpoints).m_p[uVar15];
              if (bVar2) {
                uVar8 = 0;
                do {
                  bVar17 = (uint)*(byte *)((long)&local_c0 + uVar8) <=
                           *(byte *)((long)&local_b0 + uVar8) + 3;
                  bVar18 = (uint)*(byte *)((long)&local_b0 + uVar8) <=
                           *(byte *)((long)&local_c0 + uVar8) + 4;
                  if (!bVar18 || !bVar17) break;
                  bVar19 = uVar8 < 2;
                  uVar8 = uVar8 + 1;
                } while (bVar19);
                lVar9 = 0;
                do {
                  bVar10 = *(char *)((long)&local_b0 + lVar9) * '\b';
                  if (bVar18 && bVar17) {
                    bVar12 = *(char *)((long)&local_c0 + lVar9) - *(char *)((long)&local_b0 + lVar9)
                             & 7;
                  }
                  else {
                    bVar10 = bVar10 & 0xf0;
                    bVar12 = *(byte *)((long)&local_c0 + lVar9) >> 1;
                  }
                  *(byte *)((long)&local_ac + lVar9) = bVar12 | bVar10;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                uVar13 = uVar13 >> 3 ^ 1;
                local_ac = CONCAT13(((byte)(local_c0 >> 0x16) & 0xfc |
                                    (byte)(local_9c >> 0x13) & 0xe0) + (bVar18 && bVar17) * '\x02' |
                                    (byte)uVar13,(undefined3)local_ac);
                *(undefined4 *)local_78 = local_ac;
                *(uint *)(local_78 + 4) = (local_a8->m_color_selectors).m_p[uVar3 * 2 | uVar13];
              }
              uVar16 = uVar16 + 1;
              local_78 = local_78 + 8;
              this_00 = local_38;
              pcVar11 = local_a8;
            } while (uVar16 != local_50);
          }
          local_c4 = local_c4 + 1;
          local_78 = local_78 + local_60 * 4;
        } while (local_c4 != local_bc);
        pcVar6 = pcVar11->m_pHeader;
      }
      local_68 = local_68 + 1;
    } while (local_68 < (pcVar6->m_faces).m_buf[0]);
  }
  return true;
}

Assistant:

bool unpack_etc1(uint8** pDst, uint32 output_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_color_endpoints = m_color_endpoints.size();
    const uint32 width = (output_width + 1) & ~1;
    const uint32 height = (output_height + 1) & ~1;
    const int32 delta_pitch_in_dwords = (output_pitch_in_bytes >> 2) - (width << 1);

    if (m_block_buffer.size() < width << 1)
      m_block_buffer.resize(width << 1);

    uint32 color_endpoint_index = 0, diagonal_color_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 2) {
          visible = visible && x < output_width;
          block_buffer_element &buffer = m_block_buffer[x << 1];
          uint8 endpoint_reference, block_endpoint[4], e0[4], e1[4];
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            reference_group = m_codec.decode(m_reference_encoding_dm);
            endpoint_reference = (reference_group & 3) | (reference_group >> 2 & 12);
            buffer.endpoint_reference = (reference_group >> 2 & 3) | (reference_group >> 4 & 12);
          }
          if (!(endpoint_reference & 3)) {
            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
            if (color_endpoint_index >= num_color_endpoints)
              color_endpoint_index -= num_color_endpoints;
            buffer.color_endpoint_index = color_endpoint_index;
          } else if ((endpoint_reference & 3) == 1) {
            buffer.color_endpoint_index = color_endpoint_index;
          } else if ((endpoint_reference & 3) == 3) {
            buffer.color_endpoint_index = color_endpoint_index = diagonal_color_endpoint_index;
          } else {
            color_endpoint_index = buffer.color_endpoint_index;
          }
          endpoint_reference >>= 2;
          *(uint32*)&e0 = m_color_endpoints[color_endpoint_index];
          uint32 selector_index = m_codec.decode(m_selector_delta_dm[0]);
          if (endpoint_reference) {
            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
            if (color_endpoint_index >= num_color_endpoints)
              color_endpoint_index -= num_color_endpoints;
          }
          diagonal_color_endpoint_index = m_block_buffer[x << 1 | 1].color_endpoint_index;
          m_block_buffer[x << 1 | 1].color_endpoint_index = color_endpoint_index;
          *(uint32*)&e1 = m_color_endpoints[color_endpoint_index];
          if (visible) {
            uint32 flip = endpoint_reference >> 1 ^ 1, diff = 1;
            for (uint c = 0; diff && c < 3; c++)
              diff = e0[c] + 3 >= e1[c] && e1[c] + 4 >= e0[c] ? diff : 0;
            for (uint c = 0; c < 3; c++)
              block_endpoint[c] = diff ? e0[c] << 3 | ((e1[c] - e0[c]) & 7) : (e0[c] << 3 & 0xF0) | e1[c] >> 1;
            block_endpoint[3] = e0[3] << 5 | e1[3] << 2 | diff << 1 | flip;
            pData[0] = *(uint32*)&block_endpoint;
            pData[1] = m_color_selectors[selector_index << 1 | flip];
          }
        }
      }
    }
    return true;
  }